

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::PlyParser::parseHeader
          (PlyParser *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *header)

{
  _List_node_base *p_Var1;
  bool bVar2;
  runtime_error *prVar3;
  Format FVar4;
  string version;
  string fmt;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream line;
  
  do {
    p_Var1 = (header->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)header) {
      return;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&line,(string *)(p_Var1 + 1),_S_out|_S_in);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(header);
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    tag._M_string_length = 0;
    tag.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&line,(string *)&tag);
    bVar2 = std::operator==(&tag,"comment");
    if (!bVar2) {
      bVar2 = std::operator==(&tag,"format");
      if (bVar2) {
        fmt._M_dataplus._M_p = (pointer)&fmt.field_2;
        fmt._M_string_length = 0;
        fmt.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&line,(string *)&fmt);
        bVar2 = std::operator==(&fmt,"ascii");
        FVar4 = ASCII;
        if (!bVar2) {
          bVar2 = std::operator==(&fmt,"binary_big_endian");
          FVar4 = BINARY_BIG_ENDIAN;
          if (!bVar2) {
            bVar2 = std::operator==(&fmt,"binary_little_endian");
            FVar4 = BINARY_LITTLE_ENDIAN;
            if (!bVar2) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&version,"invalid PLY file format: ",&fmt);
              std::runtime_error::runtime_error(prVar3,(string *)&version);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        this->format = FVar4;
        version._M_dataplus._M_p = (pointer)&version.field_2;
        version._M_string_length = 0;
        version.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&line,(string *)&version);
        bVar2 = std::operator!=(&version,"1.0");
        if (bVar2) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_1d8,"invalid PLY file version: ",&version);
          std::runtime_error::runtime_error(prVar3,(string *)&local_1d8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::~string((string *)&version);
        std::__cxx11::string::~string((string *)&fmt);
      }
      else {
        bVar2 = std::operator==(&tag,"end_header");
        if (bVar2) {
          std::__cxx11::string::~string((string *)&tag);
          std::__cxx11::stringstream::~stringstream((stringstream *)&line);
          return;
        }
        bVar2 = std::operator==(&tag,"element");
        if (!bVar2) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&fmt,"unknown tag in PLY file: ",&tag);
          std::runtime_error::runtime_error(prVar3,(string *)&fmt);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        parseElementDescr(this,&line,header);
      }
    }
    std::__cxx11::string::~string((string *)&tag);
    std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  } while( true );
}

Assistant:

void parseHeader(std::list<std::string>& header) 
      {
        while (!header.empty())
        {          
          std::stringstream line(header.front()); 
          header.pop_front();
          
          std::string tag; line >> tag;
          
          /* ignore comments */
          if (tag == "comment") {
          }
          
          /* parse format */
          else if (tag == "format")  
          {
            std::string fmt; line >> fmt;
            if (fmt == "ascii") format = ASCII;
            else if (fmt == "binary_big_endian") format = BINARY_BIG_ENDIAN;
            else if (fmt == "binary_little_endian") format = BINARY_LITTLE_ENDIAN;
            else throw std::runtime_error("invalid PLY file format: " + fmt);
            std::string  version; line >> version;
            if (version != "1.0") throw std::runtime_error("invalid PLY file version: " + version);
          }

          /* parse end of header tag */
          else if (tag == "end_header")
            break;
          
          /* parse elements */
          else if (tag == "element") parseElementDescr(line,header);
      
          /* report unknown tags */
          else throw std::runtime_error("unknown tag in PLY file: " + tag);
        }
      }